

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O2

floatx80 floatx80_getexp_m68k(floatx80 a,float_status *status)

{
  floatx80 fVar1;
  int32_t aExp;
  uint64_t aSig;
  
  fVar1.low = a.low;
  aExp = a._8_4_ & 0x7fff;
  aSig = fVar1.low;
  if (((undefined1  [16])a & (undefined1  [16])0x7fff) == (undefined1  [16])0x0) {
    if (fVar1.low == 0) {
      return (floatx80)(ZEXT416(a._8_4_ & 0x8000) << 0x40);
    }
    normalizeFloatx80Subnormal_m68k(fVar1.low,&aExp,&aSig);
  }
  else if (aExp == 0x7fff) {
    if (((undefined1  [16])a & (undefined1  [16])0x7fffffffffffffff) == (undefined1  [16])0x0) {
      float_raise_m68k('\x01',status);
      fVar1 = floatx80_default_nan_m68k(status);
      return fVar1;
    }
    fVar1._8_8_ = a._8_8_ & 0xffffffff;
    fVar1 = propagateFloatx80NaNOneArg(fVar1,status);
    return fVar1;
  }
  fVar1 = int32_to_floatx80_m68k(aExp + -0x3fff,status);
  return fVar1;
}

Assistant:

floatx80 floatx80_getexp(floatx80 a, float_status *status)
{
    flag aSign;
    int32_t aExp;
    uint64_t aSig;

    aSig = extractFloatx80Frac(a);
    aExp = extractFloatx80Exp(a);
    aSign = extractFloatx80Sign(a);

    if (aExp == 0x7FFF) {
        if ((uint64_t) (aSig << 1)) {
            return propagateFloatx80NaNOneArg(a , status);
        }
        float_raise(float_flag_invalid , status);
        return floatx80_default_nan(status);
    }

    if (aExp == 0) {
        if (aSig == 0) {
            return packFloatx80(aSign, 0, 0);
        }
        normalizeFloatx80Subnormal(aSig, &aExp, &aSig);
    }

    return int32_to_floatx80(aExp - 0x3FFF, status);
}